

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

int keyword(void)

{
  byte bVar1;
  char *cptr;
  uint uVar2;
  int c;
  ushort **ppuVar3;
  void *pvVar4;
  ulong uVar5;
  
  cptr = ::cptr;
  bVar1 = ::cptr[1];
  uVar5 = (ulong)(char)bVar1;
  ::cptr = ::cptr + 1;
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 4) == 0) {
    ::cptr = cptr + 2;
    if (bVar1 < 0x3c) {
      if (bVar1 < 0x30) {
        if (bVar1 == 0x24) {
          return 8;
        }
        if (bVar1 == 0x25) {
          return 4;
        }
      }
      else {
        if (bVar1 == 0x30) {
          return 0;
        }
        if (bVar1 == 0x32) {
          return 3;
        }
      }
    }
    else if (bVar1 < 0x40) {
      if (bVar1 == 0x3c) {
        return 1;
      }
      if (bVar1 == 0x3e) {
        return 2;
      }
    }
    else {
      if (bVar1 == 0x40) {
        return 0xb;
      }
      if (bVar1 == 0x5c) {
        return 4;
      }
      if (bVar1 == 0x7b) {
        return 5;
      }
    }
  }
  else {
    cinc = 0;
    while ((((*ppuVar3)[(char)uVar5] & 8) != 0 ||
           ((uVar2 = ((uint)uVar5 & 0xff) - 0x24, uVar2 < 0x3c &&
            ((0x800000000000401U >> ((ulong)uVar2 & 0x3f) & 1) != 0))))) {
      c = tolower((int)(char)uVar5);
      cachec(c);
      uVar5 = (ulong)(byte)::cptr[1];
      ::cptr = ::cptr + 1;
    }
    cachec(0);
    pvVar4 = bsearch(cache,keywords,0xd,0x10,strcmp);
    if (pvVar4 != (void *)0x0) {
      return *(int *)((long)pvVar4 + 0xc);
    }
  }
  syntax_error(input_file->lineno,line,cptr);
  return 0;
}

Assistant:

int keyword()
{
  register int	c;
  char		*t_cptr = cptr;
  struct keyword	*key;

  c = *++cptr;
  if (isalpha(c)) {
    cinc = 0;
    while (isalnum(c) || c == '_' || c == '.' || c == '$') {
      cachec(tolower(c));
      c = *++cptr;
    }
    cachec(NUL);

    if ((key = bsearch(cache, keywords, sizeof(keywords)/sizeof(*key),
		       sizeof(*key),
		       (int (*)(const void *, const void *))strcmp)))
      return key->token;
  } else {
    ++cptr;
    if (c == '{') return (TEXT);
    if (c == '%' || c == '\\') return (MARK);
    if (c == '<') return (LEFT);
    if (c == '>') return (RIGHT);
    if (c == '0') return (TOKEN);
    if (c == '2') return (NONASSOC);
    if (c == '@') return (LOCATION);
    if (c == '$') return (UNION);
  }
  syntax_error(input_file->lineno, line, t_cptr);
  /*NOTREACHED*/
  return 0;
}